

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O0

void nls(nls_object obj,custom_funcmult *funcmult,custom_jacobian *jacobian,double *xi)

{
  int iVar1;
  int iVar2;
  double *fvec_00;
  double *fjac_00;
  double *diag_00;
  double *qtf_00;
  int *ipvt_00;
  int *ipvt;
  double *qtf;
  double *diag;
  double *fjac;
  double *fvec;
  int nprint;
  int N;
  int M;
  int i;
  int info;
  double *xi_local;
  custom_jacobian *jacobian_local;
  custom_funcmult *funcmult_local;
  nls_object obj_local;
  
  iVar1 = obj->M;
  iVar2 = obj->N;
  fvec_00 = (double *)malloc((long)iVar1 << 3);
  fjac_00 = (double *)malloc((long)iVar1 * 8 * (long)iVar2);
  diag_00 = (double *)malloc((long)iVar2 << 3);
  qtf_00 = (double *)malloc((long)iVar2 << 3);
  ipvt_00 = (int *)malloc((long)iVar2 << 2);
  for (N = 0; N < iVar2; N = N + 1) {
    obj->xopt[N] = xi[N];
  }
  if (jacobian == (custom_jacobian *)0x0) {
    M = lmdif(funcmult,obj->xopt,obj->M,obj->N,fvec_00,fjac_00,obj->ldfjac,obj->Maxfev,diag_00,
              obj->mode,obj->factor,0,obj->eps,obj->epsfcn,obj->ftol,obj->gtol,obj->xtol,&obj->nfev,
              &obj->njev,ipvt_00,qtf_00);
  }
  else {
    M = lmder(funcmult,jacobian,obj->xopt,obj->M,obj->N,fvec_00,fjac_00,obj->ldfjac,obj->Maxfev,
              diag_00,obj->mode,obj->factor,0,obj->eps,obj->ftol,obj->gtol,obj->xtol,&obj->nfev,
              &obj->njev,ipvt_00,qtf_00);
  }
  obj->retval = M;
  obj->Iter = obj->nfev;
  free(fvec_00);
  free(fjac_00);
  free(diag_00);
  free(qtf_00);
  free(ipvt_00);
  return;
}

Assistant:

void nls(nls_object obj, custom_funcmult *funcmult, custom_jacobian *jacobian,
		double *xi) {

	int info,i,M,N,nprint;
	double *fvec,*fjac,*diag,*qtf;
	int *ipvt;

	M = obj->M;
	N = obj-> N;
	nprint = 0;

	fvec = (double*) malloc(sizeof(double) *M);
	fjac = (double*) malloc(sizeof(double) *M * N);
	diag = (double*) malloc(sizeof(double) *N);
	qtf = (double*) malloc(sizeof(double) *N);
	ipvt = (int*) malloc(sizeof(int) *N);

	for(i = 0; i < N;++i) {
		obj->xopt[i] = xi[i];
	}

	if (jacobian == NULL) {
		info = lmdif(funcmult,obj->xopt,obj->M,obj->N,fvec,fjac,obj->ldfjac,obj->Maxfev,diag,obj->mode,
				obj->factor,nprint,obj->eps,obj->epsfcn,obj->ftol,obj->gtol,obj->xtol,&obj->nfev,&obj->njev,ipvt,qtf);
	} else {
		info = lmder(funcmult,jacobian,obj->xopt,obj->M,obj->N,fvec,fjac,obj->ldfjac,obj->Maxfev,diag,obj->mode,
				obj->factor,nprint,obj->eps,obj->ftol,obj->gtol,obj->xtol,&obj->nfev,&obj->njev,ipvt,qtf);
	}
	obj->retval = info;
	obj->Iter = obj->nfev;

	free(fvec);
	free(fjac);
	free(diag);
	free(qtf);
	free(ipvt);

}